

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_bip_vectors(void)

{
  int iVar1;
  uchar msg_15 [100];
  uchar sig_16 [64];
  uchar aux_rand_7 [32];
  uchar pk_18 [32];
  uchar sk_7 [32];
  uchar sig_15 [64];
  uchar msg_14 [17];
  uchar aux_rand_6 [32];
  uchar pk_17 [32];
  uchar sk_6 [32];
  uchar sig_14 [64];
  uchar msg_13 [1];
  uchar aux_rand_5 [32];
  uchar pk_16 [32];
  uchar sk_5 [32];
  uchar sig_13 [64];
  uchar aux_rand_4 [32];
  uchar pk_15 [32];
  uchar sk_4 [32];
  secp256k1_xonly_pubkey pk_parsed_1;
  uchar pk_14 [32];
  uchar sig_12 [64];
  uchar msg_12 [32];
  uchar pk_13 [32];
  uchar sig_11 [64];
  uchar msg_11 [32];
  uchar pk_12 [32];
  uchar sig_10 [64];
  uchar msg_10 [32];
  uchar pk_11 [32];
  uchar sig_9 [64];
  uchar msg_9 [32];
  uchar pk_10 [32];
  uchar sig_8 [64];
  uchar msg_8 [32];
  uchar pk_9 [32];
  uchar sig_7 [64];
  uchar msg_7 [32];
  uchar pk_8 [32];
  uchar sig_6 [64];
  uchar msg_6 [32];
  uchar pk_7 [32];
  uchar sig_5 [64];
  uchar msg_5 [32];
  uchar pk_6 [32];
  secp256k1_xonly_pubkey pk_parsed;
  uchar pk_5 [32];
  uchar sig_4 [64];
  uchar msg_4 [32];
  uchar pk_4 [32];
  uchar sig_3 [64];
  uchar msg_3 [32];
  uchar aux_rand_3 [32];
  uchar pk_3 [32];
  uchar sk_3 [32];
  uchar sig_2 [64];
  uchar msg_2 [32];
  uchar aux_rand_2 [32];
  uchar pk_2 [32];
  uchar sk_2 [32];
  uchar sig_1 [64];
  uchar msg_1 [32];
  uchar aux_rand_1 [32];
  uchar pk_1 [32];
  uchar sk_1 [32];
  uchar sig [64];
  uchar msg [32];
  uchar aux_rand [32];
  uchar pk [32];
  uchar sk [32];
  undefined1 auStackY_b68 [60];
  int in_stack_fffffffffffff4d4;
  uchar *in_stack_fffffffffffff4d8;
  size_t in_stack_fffffffffffff4e0;
  uchar *in_stack_fffffffffffff4e8;
  uchar *in_stack_fffffffffffff4f0;
  undefined1 local_af8 [16];
  uchar *in_stack_fffffffffffff518;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff520;
  secp256k1_context *in_stack_fffffffffffff528;
  undefined1 local_ab8 [32];
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined8 local_a80;
  undefined8 local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined8 local_a60;
  undefined1 local_a58 [48];
  uchar *in_stack_fffffffffffff5d8;
  size_t in_stack_fffffffffffff5e0;
  uchar *in_stack_fffffffffffff5e8;
  uchar *msg_16;
  uchar *in_stack_fffffffffffff5f0;
  uchar *aux_rand_00;
  undefined1 in_stack_fffffffffffff5f8;
  undefined1 uVar2;
  undefined7 in_stack_fffffffffffff5f9;
  uchar *in_stack_fffffffffffff600;
  undefined1 local_9f8 [32];
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined8 local_9a8;
  undefined8 local_9a0;
  undefined1 local_998 [79];
  undefined1 local_949;
  undefined1 local_948 [32];
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined1 local_8e8 [64];
  undefined1 local_8a8 [32];
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined8 local_850;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8 [64];
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined1 local_768 [64];
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined1 local_6e8 [64];
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined1 local_668 [64];
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined1 local_5e8 [64];
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined1 local_568 [64];
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined1 local_4e8 [64];
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined1 local_468 [64];
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined1 local_388 [64];
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined1 local_308 [64];
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined1 local_248 [64];
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188 [64];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [64];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = 0;
  local_20 = 0;
  local_18 = 0;
  local_10 = 0x300000000000000;
  local_48 = 0x10c35892018a30f9;
  local_40 = 0x29529df8854f3449;
  local_38 = 0xb0996f8345c831b5;
  local_30 = 0xf936e0bc13f10186;
  memset(local_68,0,0x20);
  memset(local_88,0,0x20);
  memcpy(local_c8,&DAT_00177330,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,
             (uchar *)CONCAT71(in_stack_fffffffffffff5f9,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
             in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_e8 = 0x6a2aed8a6251e1b7;
  local_e0 = 0xc7f3f49c805871bf;
  local_d8 = 0x56dab4380f16e762;
  local_d0 = 0xefcf905104d984a7;
  local_108 = 0x5f1c672a7fd7f1df;
  local_100 = 0xbe4123db26371836;
  local_f8 = 0xd8cedea21daefe58;
  local_f0 = 0x59a62b507b0f2443;
  local_128 = 0;
  local_120 = 0;
  local_118 = 0;
  local_110 = 0x100000000000000;
  local_148 = 0xd308a385886a3f24;
  local_140 = 0x447370032e8a1913;
  local_138 = 0xd0319f29223809a4;
  local_130 = 0x896c4eec98fa2e08;
  memcpy(local_188,&DAT_00177370,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,
             (uchar *)CONCAT71(in_stack_fffffffffffff5f9,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
             in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_1a8 = 0x34c26821a2da0fc9;
  local_1a0 = 0xd11cdc808b62c6c4;
  local_198 = 0x74cc678a084e0229;
  local_190 = 0xc9e5143ba6be0b02;
  local_1c8 = 0x137e77c5fe8a30dd;
  local_1c0 = 0xccb7c19c2ba71f12;
  local_1b8 = 0xc986b00953713901;
  local_1b0 = 0xb84e7769d98fe160;
  local_1e8 = 0xaed7b42438a57ac8;
  local_1e0 = 0xccbcbbb5a235b02e;
  local_1d8 = 0x2c69d1c6cd760e08;
  local_1d0 = 0x6d9e698d7620b4b;
  local_208 = 0x1adfbcb3d8582d7e;
  local_200 = 0xdf9549082c7deba;
  local_1f8 = 0x33776cb5aa0598da;
  local_1f0 = 0x5cb708a5d0b92430;
  memcpy(local_248,&DAT_001773b0,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,
             (uchar *)CONCAT71(in_stack_fffffffffffff5f9,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
             in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_268 = 0x81739377262b430b;
  local_260 = 0xd0ec662ab05bf0ae;
  local_258 = 0x54a23fcf62307712;
  local_250 = 0x101740d28ef5449e;
  local_288 = 0x25f50551f9dfd125;
  local_280 = 0xad96a928f622403c;
  local_278 = 0x8a461df2fb950d3a;
  local_270 = 0x17f5d860c1f8331b;
  local_2a8 = 0xffffffffffffffff;
  local_2a0 = 0xffffffffffffffff;
  local_298 = 0xffffffffffffffff;
  local_290 = 0xffffffffffffffff;
  local_2c8 = 0xffffffffffffffff;
  local_2c0 = 0xffffffffffffffff;
  local_2b8 = 0xffffffffffffffff;
  local_2b0 = 0xffffffffffffffff;
  memcpy(local_308,&DAT_001773f0,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,
             (uchar *)CONCAT71(in_stack_fffffffffffff5f9,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
             in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_328 = 0x12e499bb09359cd6;
  local_320 = 0x83724e54e80f8be6;
  local_318 = 0xaae28b6d7430fa7d;
  local_310 = 0xb9c72dd2295f9765;
  local_348 = 0xb283cc8ff6c3f34d;
  local_340 = 0x24a73104c9429d7e;
  local_338 = 0x9b591ac87578f199;
  local_330 = 0x36769b989986c56;
  memcpy(local_388,&DAT_00177430,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_3a8 = 0x507767db4ceafdee;
  local_3a0 = 0x21cfea07e8fe20a4;
  local_398 = 0x8776b979ae9898eb;
  local_390 = 0x344a2d4aa0fae466;
  iVar1 = secp256k1_xonly_pubkey_parse
                    (in_stack_fffffffffffff528,in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,399,"test condition failed: !secp256k1_xonly_pubkey_parse(CTX, &pk_parsed, pk)");
    abort();
  }
  local_408 = 0x5f1c672a7fd7f1df;
  local_400 = 0xbe4123db26371836;
  local_3f8 = 0xd8cedea21daefe58;
  local_3f0 = 0x59a62b507b0f2443;
  local_428 = 0xd308a385886a3f24;
  local_420 = 0x447370032e8a1913;
  local_418 = 0xd0319f29223809a4;
  local_410 = 0x896c4eec98fa2e08;
  memcpy(local_468,&DAT_00177470,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_488 = 0x5f1c672a7fd7f1df;
  local_480 = 0xbe4123db26371836;
  local_478 = 0xd8cedea21daefe58;
  local_470 = 0x59a62b507b0f2443;
  local_4a8 = 0xd308a385886a3f24;
  local_4a0 = 0x447370032e8a1913;
  local_498 = 0xd0319f29223809a4;
  local_490 = 0x896c4eec98fa2e08;
  memcpy(local_4e8,&DAT_001774b0,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_508 = 0x5f1c672a7fd7f1df;
  local_500 = 0xbe4123db26371836;
  local_4f8 = 0xd8cedea21daefe58;
  local_4f0 = 0x59a62b507b0f2443;
  local_528 = 0xd308a385886a3f24;
  local_520 = 0x447370032e8a1913;
  local_518 = 0xd0319f29223809a4;
  local_510 = 0x896c4eec98fa2e08;
  memcpy(local_568,&DAT_001774f0,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_588 = 0x5f1c672a7fd7f1df;
  local_580 = 0xbe4123db26371836;
  local_578 = 0xd8cedea21daefe58;
  local_570 = 0x59a62b507b0f2443;
  local_5a8 = 0xd308a385886a3f24;
  local_5a0 = 0x447370032e8a1913;
  local_598 = 0xd0319f29223809a4;
  local_590 = 0x896c4eec98fa2e08;
  memcpy(local_5e8,&DAT_00177530,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_608 = 0x5f1c672a7fd7f1df;
  local_600 = 0xbe4123db26371836;
  local_5f8 = 0xd8cedea21daefe58;
  local_5f0 = 0x59a62b507b0f2443;
  local_628 = 0xd308a385886a3f24;
  local_620 = 0x447370032e8a1913;
  local_618 = 0xd0319f29223809a4;
  local_610 = 0x896c4eec98fa2e08;
  memcpy(local_668,&DAT_00177570,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_688 = 0x5f1c672a7fd7f1df;
  local_680 = 0xbe4123db26371836;
  local_678 = 0xd8cedea21daefe58;
  local_670 = 0x59a62b507b0f2443;
  local_6a8 = 0xd308a385886a3f24;
  local_6a0 = 0x447370032e8a1913;
  local_698 = 0xd0319f29223809a4;
  local_690 = 0x896c4eec98fa2e08;
  memcpy(local_6e8,&DAT_001775b0,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_708 = 0x5f1c672a7fd7f1df;
  local_700 = 0xbe4123db26371836;
  local_6f8 = 0xd8cedea21daefe58;
  local_6f0 = 0x59a62b507b0f2443;
  local_728 = 0xd308a385886a3f24;
  local_720 = 0x447370032e8a1913;
  local_718 = 0xd0319f29223809a4;
  local_710 = 0x896c4eec98fa2e08;
  memcpy(local_768,&DAT_001775f0,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_788 = 0x5f1c672a7fd7f1df;
  local_780 = 0xbe4123db26371836;
  local_778 = 0xd8cedea21daefe58;
  local_770 = 0x59a62b507b0f2443;
  local_7a8 = 0xd308a385886a3f24;
  local_7a0 = 0x447370032e8a1913;
  local_798 = 0xd0319f29223809a4;
  local_790 = 0x896c4eec98fa2e08;
  memcpy(local_7e8,&DAT_00177630,0x40);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_808 = 0xffffffffffffffff;
  local_800 = 0xffffffffffffffff;
  local_7f8 = 0xffffffffffffffff;
  local_7f0 = 0x30fcfffffeffffff;
  iVar1 = secp256k1_xonly_pubkey_parse
                    (in_stack_fffffffffffff528,in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x26b,"test condition failed: !secp256k1_xonly_pubkey_parse(CTX, &pk_parsed, pk)");
    abort();
  }
  local_868 = 0x4003400340034003;
  local_860 = 0x4003400340034003;
  local_858 = 0x4003400340034003;
  local_850 = 0x4003400340034003;
  local_888 = 0xc43a39b453aa8c77;
  local_880 = 0x22877a49094d7767;
  local_878 = 0x238be6f6b6faf94b;
  local_870 = 0x17d16f4d32976408;
  memset(local_8a8,0,0x20);
  memcpy(local_8e8,&DAT_00177670,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,
             (uchar *)CONCAT71(in_stack_fffffffffffff5f9,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
             in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_908 = 0x4003400340034003;
  local_900 = 0x4003400340034003;
  local_8f8 = 0x4003400340034003;
  local_8f0 = 0x4003400340034003;
  local_928 = 0xc43a39b453aa8c77;
  local_920 = 0x22877a49094d7767;
  local_918 = 0x238be6f6b6faf94b;
  local_910 = 0x17d16f4d32976408;
  memset(local_948,0,0x20);
  local_949 = 0x11;
  memcpy(local_998,&DAT_001776c0,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,
             (uchar *)CONCAT71(in_stack_fffffffffffff5f9,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
             in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_9b8 = 0x4003400340034003;
  local_9b0 = 0x4003400340034003;
  local_9a8 = 0x4003400340034003;
  local_9a0 = 0x4003400340034003;
  local_9d8 = 0xc43a39b453aa8c77;
  local_9d0 = 0x22877a49094d7767;
  local_9c8 = 0x238be6f6b6faf94b;
  local_9c0 = 0x17d16f4d32976408;
  memset(local_9f8,0,0x20);
  msg_16 = (uchar *)0x807060504030201;
  aux_rand_00 = (uchar *)0x100f0e0d0c0b0a09;
  uVar2 = 0x11;
  memcpy(local_a58,&DAT_00177720,0x40);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,(uchar *)CONCAT71(in_stack_fffffffffffff5f9,uVar2),
             aux_rand_00,msg_16,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  local_a78 = 0x4003400340034003;
  local_a70 = 0x4003400340034003;
  local_a68 = 0x4003400340034003;
  local_a60 = 0x4003400340034003;
  local_a98 = 0xc43a39b453aa8c77;
  local_a90 = 0x22877a49094d7767;
  local_a88 = 0x238be6f6b6faf94b;
  local_a80 = 0x17d16f4d32976408;
  memset(local_ab8,0,0x20);
  memcpy(local_af8,&DAT_00177760,0x40);
  memset(auStackY_b68,0x99,100);
  test_schnorrsig_bip_vectors_check_signing
            (in_stack_fffffffffffff600,(uchar *)CONCAT71(in_stack_fffffffffffff5f9,uVar2),
             aux_rand_00,msg_16,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  test_schnorrsig_bip_vectors_check_verify
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
             in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4);
  return;
}

Assistant:

static void test_schnorrsig_bip_vectors(void) {
    {
        /* Test vector 0 */
        const unsigned char sk[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x03
        };
        const unsigned char pk[32] = {
            0xF9, 0x30, 0x8A, 0x01, 0x92, 0x58, 0xC3, 0x10,
            0x49, 0x34, 0x4F, 0x85, 0xF8, 0x9D, 0x52, 0x29,
            0xB5, 0x31, 0xC8, 0x45, 0x83, 0x6F, 0x99, 0xB0,
            0x86, 0x01, 0xF1, 0x13, 0xBC, 0xE0, 0x36, 0xF9
        };
        const unsigned char aux_rand[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00
        };
        const unsigned char msg[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00
        };
        const unsigned char sig[64] = {
            0xE9, 0x07, 0x83, 0x1F, 0x80, 0x84, 0x8D, 0x10,
            0x69, 0xA5, 0x37, 0x1B, 0x40, 0x24, 0x10, 0x36,
            0x4B, 0xDF, 0x1C, 0x5F, 0x83, 0x07, 0xB0, 0x08,
            0x4C, 0x55, 0xF1, 0xCE, 0x2D, 0xCA, 0x82, 0x15,
            0x25, 0xF6, 0x6A, 0x4A, 0x85, 0xEA, 0x8B, 0x71,
            0xE4, 0x82, 0xA7, 0x4F, 0x38, 0x2D, 0x2C, 0xE5,
            0xEB, 0xEE, 0xE8, 0xFD, 0xB2, 0x17, 0x2F, 0x47,
            0x7D, 0xF4, 0x90, 0x0D, 0x31, 0x05, 0x36, 0xC0
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 1 */
        const unsigned char sk[32] = {
            0xB7, 0xE1, 0x51, 0x62, 0x8A, 0xED, 0x2A, 0x6A,
            0xBF, 0x71, 0x58, 0x80, 0x9C, 0xF4, 0xF3, 0xC7,
            0x62, 0xE7, 0x16, 0x0F, 0x38, 0xB4, 0xDA, 0x56,
            0xA7, 0x84, 0xD9, 0x04, 0x51, 0x90, 0xCF, 0xEF
        };
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char aux_rand[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x68, 0x96, 0xBD, 0x60, 0xEE, 0xAE, 0x29, 0x6D,
            0xB4, 0x8A, 0x22, 0x9F, 0xF7, 0x1D, 0xFE, 0x07,
            0x1B, 0xDE, 0x41, 0x3E, 0x6D, 0x43, 0xF9, 0x17,
            0xDC, 0x8D, 0xCF, 0x8C, 0x78, 0xDE, 0x33, 0x41,
            0x89, 0x06, 0xD1, 0x1A, 0xC9, 0x76, 0xAB, 0xCC,
            0xB2, 0x0B, 0x09, 0x12, 0x92, 0xBF, 0xF4, 0xEA,
            0x89, 0x7E, 0xFC, 0xB6, 0x39, 0xEA, 0x87, 0x1C,
            0xFA, 0x95, 0xF6, 0xDE, 0x33, 0x9E, 0x4B, 0x0A
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 2 */
        const unsigned char sk[32] = {
            0xC9, 0x0F, 0xDA, 0xA2, 0x21, 0x68, 0xC2, 0x34,
            0xC4, 0xC6, 0x62, 0x8B, 0x80, 0xDC, 0x1C, 0xD1,
            0x29, 0x02, 0x4E, 0x08, 0x8A, 0x67, 0xCC, 0x74,
            0x02, 0x0B, 0xBE, 0xA6, 0x3B, 0x14, 0xE5, 0xC9
        };
        const unsigned char pk[32] = {
            0xDD, 0x30, 0x8A, 0xFE, 0xC5, 0x77, 0x7E, 0x13,
            0x12, 0x1F, 0xA7, 0x2B, 0x9C, 0xC1, 0xB7, 0xCC,
            0x01, 0x39, 0x71, 0x53, 0x09, 0xB0, 0x86, 0xC9,
            0x60, 0xE1, 0x8F, 0xD9, 0x69, 0x77, 0x4E, 0xB8
        };
        const unsigned char aux_rand[32] = {
            0xC8, 0x7A, 0xA5, 0x38, 0x24, 0xB4, 0xD7, 0xAE,
            0x2E, 0xB0, 0x35, 0xA2, 0xB5, 0xBB, 0xBC, 0xCC,
            0x08, 0x0E, 0x76, 0xCD, 0xC6, 0xD1, 0x69, 0x2C,
            0x4B, 0x0B, 0x62, 0xD7, 0x98, 0xE6, 0xD9, 0x06
        };
        const unsigned char msg[32] = {
            0x7E, 0x2D, 0x58, 0xD8, 0xB3, 0xBC, 0xDF, 0x1A,
            0xBA, 0xDE, 0xC7, 0x82, 0x90, 0x54, 0xF9, 0x0D,
            0xDA, 0x98, 0x05, 0xAA, 0xB5, 0x6C, 0x77, 0x33,
            0x30, 0x24, 0xB9, 0xD0, 0xA5, 0x08, 0xB7, 0x5C
        };
        const unsigned char sig[64] = {
            0x58, 0x31, 0xAA, 0xEE, 0xD7, 0xB4, 0x4B, 0xB7,
            0x4E, 0x5E, 0xAB, 0x94, 0xBA, 0x9D, 0x42, 0x94,
            0xC4, 0x9B, 0xCF, 0x2A, 0x60, 0x72, 0x8D, 0x8B,
            0x4C, 0x20, 0x0F, 0x50, 0xDD, 0x31, 0x3C, 0x1B,
            0xAB, 0x74, 0x58, 0x79, 0xA5, 0xAD, 0x95, 0x4A,
            0x72, 0xC4, 0x5A, 0x91, 0xC3, 0xA5, 0x1D, 0x3C,
            0x7A, 0xDE, 0xA9, 0x8D, 0x82, 0xF8, 0x48, 0x1E,
            0x0E, 0x1E, 0x03, 0x67, 0x4A, 0x6F, 0x3F, 0xB7
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 3 */
        const unsigned char sk[32] = {
            0x0B, 0x43, 0x2B, 0x26, 0x77, 0x93, 0x73, 0x81,
            0xAE, 0xF0, 0x5B, 0xB0, 0x2A, 0x66, 0xEC, 0xD0,
            0x12, 0x77, 0x30, 0x62, 0xCF, 0x3F, 0xA2, 0x54,
            0x9E, 0x44, 0xF5, 0x8E, 0xD2, 0x40, 0x17, 0x10
        };
        const unsigned char pk[32] = {
            0x25, 0xD1, 0xDF, 0xF9, 0x51, 0x05, 0xF5, 0x25,
            0x3C, 0x40, 0x22, 0xF6, 0x28, 0xA9, 0x96, 0xAD,
            0x3A, 0x0D, 0x95, 0xFB, 0xF2, 0x1D, 0x46, 0x8A,
            0x1B, 0x33, 0xF8, 0xC1, 0x60, 0xD8, 0xF5, 0x17
        };
        const unsigned char aux_rand[32] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF
        };
        const unsigned char msg[32] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF
        };
        const unsigned char sig[64] = {
            0x7E, 0xB0, 0x50, 0x97, 0x57, 0xE2, 0x46, 0xF1,
            0x94, 0x49, 0x88, 0x56, 0x51, 0x61, 0x1C, 0xB9,
            0x65, 0xEC, 0xC1, 0xA1, 0x87, 0xDD, 0x51, 0xB6,
            0x4F, 0xDA, 0x1E, 0xDC, 0x96, 0x37, 0xD5, 0xEC,
            0x97, 0x58, 0x2B, 0x9C, 0xB1, 0x3D, 0xB3, 0x93,
            0x37, 0x05, 0xB3, 0x2B, 0xA9, 0x82, 0xAF, 0x5A,
            0xF2, 0x5F, 0xD7, 0x88, 0x81, 0xEB, 0xB3, 0x27,
            0x71, 0xFC, 0x59, 0x22, 0xEF, 0xC6, 0x6E, 0xA3
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 4 */
        const unsigned char pk[32] = {
            0xD6, 0x9C, 0x35, 0x09, 0xBB, 0x99, 0xE4, 0x12,
            0xE6, 0x8B, 0x0F, 0xE8, 0x54, 0x4E, 0x72, 0x83,
            0x7D, 0xFA, 0x30, 0x74, 0x6D, 0x8B, 0xE2, 0xAA,
            0x65, 0x97, 0x5F, 0x29, 0xD2, 0x2D, 0xC7, 0xB9
        };
        const unsigned char msg[32] = {
            0x4D, 0xF3, 0xC3, 0xF6, 0x8F, 0xCC, 0x83, 0xB2,
            0x7E, 0x9D, 0x42, 0xC9, 0x04, 0x31, 0xA7, 0x24,
            0x99, 0xF1, 0x78, 0x75, 0xC8, 0x1A, 0x59, 0x9B,
            0x56, 0x6C, 0x98, 0x89, 0xB9, 0x69, 0x67, 0x03
        };
        const unsigned char sig[64] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x3B, 0x78, 0xCE, 0x56, 0x3F,
            0x89, 0xA0, 0xED, 0x94, 0x14, 0xF5, 0xAA, 0x28,
            0xAD, 0x0D, 0x96, 0xD6, 0x79, 0x5F, 0x9C, 0x63,
            0x76, 0xAF, 0xB1, 0x54, 0x8A, 0xF6, 0x03, 0xB3,
            0xEB, 0x45, 0xC9, 0xF8, 0x20, 0x7D, 0xEE, 0x10,
            0x60, 0xCB, 0x71, 0xC0, 0x4E, 0x80, 0xF5, 0x93,
            0x06, 0x0B, 0x07, 0xD2, 0x83, 0x08, 0xD7, 0xF4
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 5 */
        const unsigned char pk[32] = {
            0xEE, 0xFD, 0xEA, 0x4C, 0xDB, 0x67, 0x77, 0x50,
            0xA4, 0x20, 0xFE, 0xE8, 0x07, 0xEA, 0xCF, 0x21,
            0xEB, 0x98, 0x98, 0xAE, 0x79, 0xB9, 0x76, 0x87,
            0x66, 0xE4, 0xFA, 0xA0, 0x4A, 0x2D, 0x4A, 0x34
        };
        secp256k1_xonly_pubkey pk_parsed;
        /* No need to check the signature of the test vector as parsing the pubkey already fails */
        CHECK(!secp256k1_xonly_pubkey_parse(CTX, &pk_parsed, pk));
    }
    {
        /* Test vector 6 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0xFF, 0xF9, 0x7B, 0xD5, 0x75, 0x5E, 0xEE, 0xA4,
            0x20, 0x45, 0x3A, 0x14, 0x35, 0x52, 0x35, 0xD3,
            0x82, 0xF6, 0x47, 0x2F, 0x85, 0x68, 0xA1, 0x8B,
            0x2F, 0x05, 0x7A, 0x14, 0x60, 0x29, 0x75, 0x56,
            0x3C, 0xC2, 0x79, 0x44, 0x64, 0x0A, 0xC6, 0x07,
            0xCD, 0x10, 0x7A, 0xE1, 0x09, 0x23, 0xD9, 0xEF,
            0x7A, 0x73, 0xC6, 0x43, 0xE1, 0x66, 0xBE, 0x5E,
            0xBE, 0xAF, 0xA3, 0x4B, 0x1A, 0xC5, 0x53, 0xE2
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 7 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x1F, 0xA6, 0x2E, 0x33, 0x1E, 0xDB, 0xC2, 0x1C,
            0x39, 0x47, 0x92, 0xD2, 0xAB, 0x11, 0x00, 0xA7,
            0xB4, 0x32, 0xB0, 0x13, 0xDF, 0x3F, 0x6F, 0xF4,
            0xF9, 0x9F, 0xCB, 0x33, 0xE0, 0xE1, 0x51, 0x5F,
            0x28, 0x89, 0x0B, 0x3E, 0xDB, 0x6E, 0x71, 0x89,
            0xB6, 0x30, 0x44, 0x8B, 0x51, 0x5C, 0xE4, 0xF8,
            0x62, 0x2A, 0x95, 0x4C, 0xFE, 0x54, 0x57, 0x35,
            0xAA, 0xEA, 0x51, 0x34, 0xFC, 0xCD, 0xB2, 0xBD
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 8 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x6C, 0xFF, 0x5C, 0x3B, 0xA8, 0x6C, 0x69, 0xEA,
            0x4B, 0x73, 0x76, 0xF3, 0x1A, 0x9B, 0xCB, 0x4F,
            0x74, 0xC1, 0x97, 0x60, 0x89, 0xB2, 0xD9, 0x96,
            0x3D, 0xA2, 0xE5, 0x54, 0x3E, 0x17, 0x77, 0x69,
            0x96, 0x17, 0x64, 0xB3, 0xAA, 0x9B, 0x2F, 0xFC,
            0xB6, 0xEF, 0x94, 0x7B, 0x68, 0x87, 0xA2, 0x26,
            0xE8, 0xD7, 0xC9, 0x3E, 0x00, 0xC5, 0xED, 0x0C,
            0x18, 0x34, 0xFF, 0x0D, 0x0C, 0x2E, 0x6D, 0xA6
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 9 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x12, 0x3D, 0xDA, 0x83, 0x28, 0xAF, 0x9C, 0x23,
            0xA9, 0x4C, 0x1F, 0xEE, 0xCF, 0xD1, 0x23, 0xBA,
            0x4F, 0xB7, 0x34, 0x76, 0xF0, 0xD5, 0x94, 0xDC,
            0xB6, 0x5C, 0x64, 0x25, 0xBD, 0x18, 0x60, 0x51
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 10 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x76, 0x15, 0xFB, 0xAF, 0x5A, 0xE2, 0x88, 0x64,
            0x01, 0x3C, 0x09, 0x97, 0x42, 0xDE, 0xAD, 0xB4,
            0xDB, 0xA8, 0x7F, 0x11, 0xAC, 0x67, 0x54, 0xF9,
            0x37, 0x80, 0xD5, 0xA1, 0x83, 0x7C, 0xF1, 0x97
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 11 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x4A, 0x29, 0x8D, 0xAC, 0xAE, 0x57, 0x39, 0x5A,
            0x15, 0xD0, 0x79, 0x5D, 0xDB, 0xFD, 0x1D, 0xCB,
            0x56, 0x4D, 0xA8, 0x2B, 0x0F, 0x26, 0x9B, 0xC7,
            0x0A, 0x74, 0xF8, 0x22, 0x04, 0x29, 0xBA, 0x1D,
            0x69, 0xE8, 0x9B, 0x4C, 0x55, 0x64, 0xD0, 0x03,
            0x49, 0x10, 0x6B, 0x84, 0x97, 0x78, 0x5D, 0xD7,
            0xD1, 0xD7, 0x13, 0xA8, 0xAE, 0x82, 0xB3, 0x2F,
            0xA7, 0x9D, 0x5F, 0x7F, 0xC4, 0x07, 0xD3, 0x9B
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 12 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFE, 0xFF, 0xFF, 0xFC, 0x2F,
            0x69, 0xE8, 0x9B, 0x4C, 0x55, 0x64, 0xD0, 0x03,
            0x49, 0x10, 0x6B, 0x84, 0x97, 0x78, 0x5D, 0xD7,
            0xD1, 0xD7, 0x13, 0xA8, 0xAE, 0x82, 0xB3, 0x2F,
            0xA7, 0x9D, 0x5F, 0x7F, 0xC4, 0x07, 0xD3, 0x9B
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 13 */
        const unsigned char pk[32] = {
            0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F,
            0x36, 0x18, 0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE,
            0x58, 0xFE, 0xAE, 0x1D, 0xA2, 0xDE, 0xCE, 0xD8,
            0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59
        };
        const unsigned char msg[32] = {
            0x24, 0x3F, 0x6A, 0x88, 0x85, 0xA3, 0x08, 0xD3,
            0x13, 0x19, 0x8A, 0x2E, 0x03, 0x70, 0x73, 0x44,
            0xA4, 0x09, 0x38, 0x22, 0x29, 0x9F, 0x31, 0xD0,
            0x08, 0x2E, 0xFA, 0x98, 0xEC, 0x4E, 0x6C, 0x89
        };
        const unsigned char sig[64] = {
            0x6C, 0xFF, 0x5C, 0x3B, 0xA8, 0x6C, 0x69, 0xEA,
            0x4B, 0x73, 0x76, 0xF3, 0x1A, 0x9B, 0xCB, 0x4F,
            0x74, 0xC1, 0x97, 0x60, 0x89, 0xB2, 0xD9, 0x96,
            0x3D, 0xA2, 0xE5, 0x54, 0x3E, 0x17, 0x77, 0x69,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFE,
            0xBA, 0xAE, 0xDC, 0xE6, 0xAF, 0x48, 0xA0, 0x3B,
            0xBF, 0xD2, 0x5E, 0x8C, 0xD0, 0x36, 0x41, 0x41
        };
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 0);
    }
    {
        /* Test vector 14 */
        const unsigned char pk[32] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFE, 0xFF, 0xFF, 0xFC, 0x30
        };
        secp256k1_xonly_pubkey pk_parsed;
        /* No need to check the signature of the test vector as parsing the pubkey already fails */
        CHECK(!secp256k1_xonly_pubkey_parse(CTX, &pk_parsed, pk));
    }
    {
        /* Test vector 15 */
        const unsigned char sk[32] = {
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
        };
        const unsigned char pk[32] = {
            0x77, 0x8C, 0xAA, 0x53, 0xB4, 0x39, 0x3A, 0xC4,
            0x67, 0x77, 0x4D, 0x09, 0x49, 0x7A, 0x87, 0x22,
            0x4B, 0xF9, 0xFA, 0xB6, 0xF6, 0xE6, 0x8B, 0x23,
            0x08, 0x64, 0x97, 0x32, 0x4D, 0x6F, 0xD1, 0x17,
        };
        const unsigned char aux_rand[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        };
        /* const unsigned char msg[0] = {}; */
        const unsigned char sig[64] = {
            0x71, 0x53, 0x5D, 0xB1, 0x65, 0xEC, 0xD9, 0xFB,
            0xBC, 0x04, 0x6E, 0x5F, 0xFA, 0xEA, 0x61, 0x18,
            0x6B, 0xB6, 0xAD, 0x43, 0x67, 0x32, 0xFC, 0xCC,
            0x25, 0x29, 0x1A, 0x55, 0x89, 0x54, 0x64, 0xCF,
            0x60, 0x69, 0xCE, 0x26, 0xBF, 0x03, 0x46, 0x62,
            0x28, 0xF1, 0x9A, 0x3A, 0x62, 0xDB, 0x8A, 0x64,
            0x9F, 0x2D, 0x56, 0x0F, 0xAC, 0x65, 0x28, 0x27,
            0xD1, 0xAF, 0x05, 0x74, 0xE4, 0x27, 0xAB, 0x63,
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, NULL, 0, sig);
        test_schnorrsig_bip_vectors_check_verify(pk, NULL, 0, sig, 1);
    }
    {
        /* Test vector 16 */
        const unsigned char sk[32] = {
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
        };
        const unsigned char pk[32] = {
            0x77, 0x8C, 0xAA, 0x53, 0xB4, 0x39, 0x3A, 0xC4,
            0x67, 0x77, 0x4D, 0x09, 0x49, 0x7A, 0x87, 0x22,
            0x4B, 0xF9, 0xFA, 0xB6, 0xF6, 0xE6, 0x8B, 0x23,
            0x08, 0x64, 0x97, 0x32, 0x4D, 0x6F, 0xD1, 0x17,
        };
        const unsigned char aux_rand[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        };
        const unsigned char msg[] = { 0x11 };
        const unsigned char sig[64] = {
            0x08, 0xA2, 0x0A, 0x0A, 0xFE, 0xF6, 0x41, 0x24,
            0x64, 0x92, 0x32, 0xE0, 0x69, 0x3C, 0x58, 0x3A,
            0xB1, 0xB9, 0x93, 0x4A, 0xE6, 0x3B, 0x4C, 0x35,
            0x11, 0xF3, 0xAE, 0x11, 0x34, 0xC6, 0xA3, 0x03,
            0xEA, 0x31, 0x73, 0xBF, 0xEA, 0x66, 0x83, 0xBD,
            0x10, 0x1F, 0xA5, 0xAA, 0x5D, 0xBC, 0x19, 0x96,
            0xFE, 0x7C, 0xAC, 0xFC, 0x5A, 0x57, 0x7D, 0x33,
            0xEC, 0x14, 0x56, 0x4C, 0xEC, 0x2B, 0xAC, 0xBF,
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 17 */
        const unsigned char sk[32] = {
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
        };
        const unsigned char pk[32] = {
            0x77, 0x8C, 0xAA, 0x53, 0xB4, 0x39, 0x3A, 0xC4,
            0x67, 0x77, 0x4D, 0x09, 0x49, 0x7A, 0x87, 0x22,
            0x4B, 0xF9, 0xFA, 0xB6, 0xF6, 0xE6, 0x8B, 0x23,
            0x08, 0x64, 0x97, 0x32, 0x4D, 0x6F, 0xD1, 0x17,
        };
        const unsigned char aux_rand[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        };
        const unsigned char msg[] = {
            0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 0x08,
            0x09, 0x0A, 0x0B, 0x0C, 0x0D, 0x0E, 0x0F, 0x10,
            0x11,
        };
        const unsigned char sig[64] = {
            0x51, 0x30, 0xF3, 0x9A, 0x40, 0x59, 0xB4, 0x3B,
            0xC7, 0xCA, 0xC0, 0x9A, 0x19, 0xEC, 0xE5, 0x2B,
            0x5D, 0x86, 0x99, 0xD1, 0xA7, 0x1E, 0x3C, 0x52,
            0xDA, 0x9A, 0xFD, 0xB6, 0xB5, 0x0A, 0xC3, 0x70,
            0xC4, 0xA4, 0x82, 0xB7, 0x7B, 0xF9, 0x60, 0xF8,
            0x68, 0x15, 0x40, 0xE2, 0x5B, 0x67, 0x71, 0xEC,
            0xE1, 0xE5, 0xA3, 0x7F, 0xD8, 0x0E, 0x5A, 0x51,
            0x89, 0x7C, 0x55, 0x66, 0xA9, 0x7E, 0xA5, 0xA5,
        };
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
    {
        /* Test vector 18 */
        const unsigned char sk[32] = {
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
            0x03, 0x40, 0x03, 0x40, 0x03, 0x40, 0x03, 0x40,
        };
        const unsigned char pk[32] = {
            0x77, 0x8C, 0xAA, 0x53, 0xB4, 0x39, 0x3A, 0xC4,
            0x67, 0x77, 0x4D, 0x09, 0x49, 0x7A, 0x87, 0x22,
            0x4B, 0xF9, 0xFA, 0xB6, 0xF6, 0xE6, 0x8B, 0x23,
            0x08, 0x64, 0x97, 0x32, 0x4D, 0x6F, 0xD1, 0x17,
        };
        const unsigned char aux_rand[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        };
        const unsigned char sig[64] = {
            0x40, 0x3B, 0x12, 0xB0, 0xD8, 0x55, 0x5A, 0x34,
            0x41, 0x75, 0xEA, 0x7E, 0xC7, 0x46, 0x56, 0x63,
            0x03, 0x32, 0x1E, 0x5D, 0xBF, 0xA8, 0xBE, 0x6F,
            0x09, 0x16, 0x35, 0x16, 0x3E, 0xCA, 0x79, 0xA8,
            0x58, 0x5E, 0xD3, 0xE3, 0x17, 0x08, 0x07, 0xE7,
            0xC0, 0x3B, 0x72, 0x0F, 0xC5, 0x4C, 0x7B, 0x23,
            0x89, 0x7F, 0xCB, 0xA0, 0xE9, 0xD0, 0xB4, 0xA0,
            0x68, 0x94, 0xCF, 0xD2, 0x49, 0xF2, 0x23, 0x67,
        };
        unsigned char msg[100];
        memset(msg, 0x99, sizeof(msg));
        test_schnorrsig_bip_vectors_check_signing(sk, pk, aux_rand, msg, sizeof(msg), sig);
        test_schnorrsig_bip_vectors_check_verify(pk, msg, sizeof(msg), sig, 1);
    }
}